

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqPubSub.cpp
# Opt level: O2

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqPubSub::Receive(ZmqPubSub *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *buff;
  long in_RSI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar3;
  int ret;
  
  iVar1 = zmq_recv(*(undefined8 *)(in_RSI + 8),*(long *)(in_RSI + 0x10),
                   *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 0x10),1);
  if (iVar1 < 1) {
    this->m_ZmqContext = (void *)0x0;
    this->m_ZmqSocket = (void *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<std::vector<char,std::allocator<char>>,int&>((int *)this);
    memcpy(*this->m_ZmqContext,*(void **)(in_RSI + 0x10),(long)iVar1);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar3.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqPubSub::Receive()
{
    int ret = zmq_recv(m_ZmqSocket, m_ReceiverBuffer.data(), m_ReceiverBuffer.size(), ZMQ_DONTWAIT);
    if (ret > 0)
    {
        auto buff = std::make_shared<std::vector<char>>(ret);
        std::memcpy(buff->data(), m_ReceiverBuffer.data(), ret);
        return buff;
    }
    return nullptr;
}